

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcAsymmetricIShapeProfileDef::~IfcAsymmetricIShapeProfileDef
          (IfcAsymmetricIShapeProfileDef *this)

{
  ~IfcAsymmetricIShapeProfileDef
            ((IfcAsymmetricIShapeProfileDef *)
             ((long)&(this->super_IfcIShapeProfileDef).super_IfcParameterizedProfileDef.
                     super_IfcProfileDef.
                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
                     _vptr_ObjectHelper +
             (long)(this->super_IfcIShapeProfileDef).super_IfcParameterizedProfileDef.
                   super_IfcProfileDef.
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
                   _vptr_ObjectHelper[-3]));
  return;
}

Assistant:

IfcAsymmetricIShapeProfileDef() : Object("IfcAsymmetricIShapeProfileDef") {}